

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain.cpp
# Opt level: O2

CBlockLocator * __thiscall CChain::GetLocator(CBlockLocator *__return_storage_ptr__,CChain *this)

{
  pointer ppCVar1;
  CBlockIndex *index;
  long in_FS_OFFSET;
  
  ppCVar1 = (this->vChain).super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl
            .super__Vector_impl_data._M_finish;
  if (ppCVar1 ==
      (this->vChain).super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    index = (CBlockIndex *)0x0;
  }
  else {
    index = ppCVar1[-1];
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    ::GetLocator(__return_storage_ptr__,index);
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

CBlockLocator CChain::GetLocator() const
{
    return ::GetLocator(Tip());
}